

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O2

void __thiscall QtPrivate::QColorPicker::paintEvent(QColorPicker *this,QPaintEvent *param_1)

{
  QPoint QVar1;
  long in_FS_OFFSET;
  QRect QVar2;
  QPainter p;
  QColor local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  _p = &DAT_aaaaaaaaaaaaaaaa;
  QPainter::QPainter(&p,&(this->super_QFrame).super_QWidget.super_QPaintDevice);
  QFrame::drawFrame(&this->super_QFrame,&p);
  QVar2 = QWidget::contentsRect((QWidget *)this);
  local_48._0_8_ = QVar2._0_8_;
  QPainter::drawPixmap(&p,(QPoint *)&local_48,&this->pix);
  if (this->crossVisible == true) {
    QVar1 = colPt(this);
    QColor::QColor(&local_48,black);
    QPainter::setPen((QColor *)&p);
    QPainter::fillRect(&p,QVar2.x1.m_i.m_i + QVar1.xp.m_i.m_i + -9,
                       QVar1.yp.m_i.m_i + QVar2.y1.m_i.m_i,0x14,2,black);
    QPainter::fillRect(&p,QVar1.xp.m_i.m_i + QVar2.x1.m_i.m_i,
                       QVar1.yp.m_i.m_i + QVar2.y1.m_i.m_i + -9,2,0x14,black);
  }
  QPainter::~QPainter(&p);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColorPicker::paintEvent(QPaintEvent* )
{
    QPainter p(this);
    drawFrame(&p);
    QRect r = contentsRect();

    p.drawPixmap(r.topLeft(), pix);

    if (crossVisible) {
        QPoint pt = colPt() + r.topLeft();
        p.setPen(Qt::black);
        p.fillRect(pt.x()-9, pt.y(), 20, 2, Qt::black);
        p.fillRect(pt.x(), pt.y()-9, 2, 20, Qt::black);
    }
}